

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O3

void __thiscall TestOutput::printFileAndLineForFailure(TestOutput *this,TestFailure *failure)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  SimpleString SStack_38;
  SimpleString local_28;
  
  (*failure->_vptr_TestFailure[2])(&local_28);
  iVar1 = (*failure->_vptr_TestFailure[5])(failure);
  printErrorInFileOnLineFormattedForWorkingEnvironment(this,&local_28,CONCAT44(extraout_var,iVar1));
  SimpleString::~SimpleString(&local_28);
  (*failure->_vptr_TestFailure[3])(&SStack_38,failure);
  (*this->_vptr_TestOutput[0xb])(this," Failure in ");
  pcVar2 = SimpleString::asCharString(&SStack_38);
  (*this->_vptr_TestOutput[0xb])(this,pcVar2);
  SimpleString::~SimpleString(&SStack_38);
  return;
}

Assistant:

void TestOutput::printFileAndLineForFailure(const TestFailure& failure)
{
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getFileName(), failure.getFailureLineNumber());
    printFailureInTest(failure.getTestName());
}